

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall duckdb_re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  char *pcVar1;
  RegexpStatus *pRVar2;
  const_pointer pcVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  size_type sVar8;
  UGroup *g;
  CharClass *pCVar9;
  ParseFlags PVar10;
  const_pointer pcVar11;
  bool bVar12;
  long lVar13;
  StringPiece t;
  StringPiece name;
  StringPiece local_1c8;
  Rune c;
  size_type sStack_1b0;
  _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
  local_1a8 [7];
  
  t.data_ = s->data_;
  t.size_ = s->size_;
  PVar10 = this->flags_;
  if (((((PVar10 >> 9 & 1) == 0) || (t.size_ < 2)) || (*t.data_ != '(')) || (t.data_[1] != '?')) {
    this->status_->code_ = kRegexpInternalError;
    _c = (const_pointer)((ulong)_c & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&sStack_1b0);
    std::operator<<((ostream *)&sStack_1b0,"Bad call to ParseState::ParsePerlFlags");
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sStack_1b0);
  }
  else {
    pcVar1 = t.data_ + 2;
    t.size_ = t.size_ - 2;
    if (((t.size_ < 3) || (*pcVar1 != 'P')) || (t.data_[3] != '<')) {
      bVar6 = false;
      bVar4 = 0;
      t.data_ = pcVar1;
      do {
        bVar12 = false;
        bVar5 = bVar6;
        while( true ) {
          while( true ) {
            do {
              bVar6 = bVar5;
              if (bVar12) {
                if ((bool)(~bVar6 | bVar4)) {
                  this->flags_ = PVar10;
                  s->data_ = t.data_;
                  s->size_ = t.size_;
                  return true;
                }
                goto LAB_01ed8b07;
              }
              if (t.size_ == 0) goto LAB_01ed8b07;
              iVar7 = StringPieceToRune(&c,&t,this->status_);
              if (iVar7 < 0) {
                return false;
              }
              bVar12 = true;
              bVar5 = bVar6;
            } while (c == 0x29);
            if (c != 0x2d) break;
            bVar4 = 0;
            bVar12 = false;
            bVar5 = true;
            if (bVar6) goto LAB_01ed8b07;
          }
          if (c != 0x3a) break;
          DoLeftParenNoCapture(this);
        }
        if (c == 0x55) {
          if (bVar6) {
            PVar10 = PVar10 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               Latin1|OneLine|MatchNL|Literal|FoldCase);
          }
          else {
            PVar10 = PVar10 | NonGreedy;
          }
        }
        else if (c == 0x73) {
          if (bVar6) {
            PVar10 = PVar10 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               NonGreedy|Latin1|OneLine|ClassNL|Literal|FoldCase);
          }
          else {
            PVar10 = PVar10 | DotNL;
          }
        }
        else if (c == 0x6d) {
          if (bVar6) {
            PVar10 = PVar10 | OneLine;
          }
          else {
            PVar10 = PVar10 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               NonGreedy|Latin1|MatchNL|Literal|FoldCase);
          }
        }
        else {
          if (c != 0x69) {
LAB_01ed8b07:
            pRVar2 = this->status_;
            pRVar2->code_ = kRegexpBadPerlOp;
            pcVar11 = s->data_;
            (pRVar2->error_arg_).data_ = pcVar11;
            (pRVar2->error_arg_).size_ = (long)t.data_ - (long)pcVar11;
            return false;
          }
          if (bVar6) {
            PVar10 = PVar10 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               NonGreedy|Latin1|OneLine|MatchNL|Literal);
          }
          else {
            PVar10 = PVar10 | FoldCase;
          }
        }
        bVar4 = 1;
      } while( true );
    }
    t.data_ = pcVar1;
    sVar8 = StringPiece::find(&t,'>',2);
    pcVar11 = t.data_;
    if (sVar8 == 0xffffffffffffffff) {
      bVar6 = IsValidUTF8(s,this->status_);
      if (bVar6) {
        pRVar2 = this->status_;
        pRVar2->code_ = kRegexpBadNamedCapture;
        sVar8 = s->size_;
        (pRVar2->error_arg_).data_ = s->data_;
        (pRVar2->error_arg_).size_ = sVar8;
      }
    }
    else {
      name.data_ = t.data_ + 2;
      name.size_ = sVar8 - 2;
      bVar6 = IsValidUTF8(&name,this->status_);
      if (bVar6) {
        pcVar11 = pcVar11 + -2;
        if (sVar8 - 2 != 0) {
          if ((IsValidCaptureName(duckdb_re2::StringPiece_const&)::cc == '\0') &&
             (iVar7 = __cxa_guard_acquire(&IsValidCaptureName(duckdb_re2::StringPiece_const&)::cc),
             iVar7 != 0)) {
            CharClassBuilder::CharClassBuilder((CharClassBuilder *)&c);
            for (lVar13 = 0; lVar13 != 0x50; lVar13 = lVar13 + 8) {
              StringPiece::StringPiece
                        (&local_1c8,*(char **)((long)&PTR_anon_var_dwarf_49f19ab_027e62e8 + lVar13))
              ;
              g = LookupGroup(&local_1c8,(UGroup *)unicode_groups,199);
              AddUGroup((CharClassBuilder *)&c,g,1,NoParseFlags);
            }
            pCVar9 = CharClassBuilder::GetCharClass((CharClassBuilder *)&c);
            std::
            _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
            ::~_Rb_tree(local_1a8);
            IsValidCaptureName(duckdb_re2::StringPiece_const&)::cc = pCVar9;
            __cxa_guard_release(&IsValidCaptureName(duckdb_re2::StringPiece_const&)::cc);
          }
          _c = name.data_;
          sStack_1b0 = name.size_;
          do {
            if (sStack_1b0 == 0) {
              DoLeftParen(this,&name);
              pcVar3 = s->data_;
              s->data_ = pcVar11 + sVar8 + 3;
              s->size_ = (size_type)(pcVar3 + (s->size_ - (long)(pcVar11 + sVar8 + 3)));
              return true;
            }
            iVar7 = StringPieceToRune((Rune *)&local_1c8,(StringPiece *)&c,(RegexpStatus *)0x0);
          } while ((-1 < iVar7) &&
                  (bVar6 = CharClass::Contains(IsValidCaptureName(duckdb_re2::StringPiece_const&)::
                                               cc,(Rune)local_1c8.data_), bVar6));
        }
        pRVar2 = this->status_;
        pRVar2->code_ = kRegexpBadNamedCapture;
        (pRVar2->error_arg_).data_ = pcVar11;
        (pRVar2->error_arg_).size_ = sVar8 + 3;
      }
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    status_->set_code(kRegexpInternalError);
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.data()-2, end+3);  // "(?P<name>"
    StringPiece name(t.data()+2, end-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(
        static_cast<size_t>(capture.data() + capture.size() - s->data()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.empty())
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->data(), static_cast<size_t>(t.data() - s->data())));
  return false;
}